

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O3

bool __thiscall draco::PointCloudDecoder::DecodePointAttributesStep1(PointCloudDecoder *this)

{
  byte bVar1;
  DecoderBuffer *pDVar2;
  pointer puVar3;
  AttributesDecoderInterface *pAVar4;
  __uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  _Var5;
  char cVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  *att_dec;
  pointer puVar10;
  long lVar11;
  bool bVar12;
  
  pDVar2 = this->buffer_;
  lVar11 = pDVar2->pos_ + 1;
  if (pDVar2->data_size_ < lVar11) {
LAB_0012ff54:
    cVar6 = '\0';
  }
  else {
    bVar1 = pDVar2->data_[pDVar2->pos_];
    pDVar2->pos_ = lVar11;
    uVar9 = (uint)bVar1;
    if (bVar1 != 0) {
      uVar8 = 0;
      do {
        iVar7 = (*this->_vptr_PointCloudDecoder[4])(this,(ulong)uVar8);
        if ((char)iVar7 == '\0') goto LAB_0012ff54;
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    puVar3 = (this->attributes_decoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar10 = (this->attributes_decoders_).
                   super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar3;
        puVar10 = puVar10 + 1) {
      pAVar4 = (puVar10->_M_t).
               super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
               .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl;
      iVar7 = (*pAVar4->_vptr_AttributesDecoderInterface[2])(pAVar4,this,this->point_cloud_);
      if ((char)iVar7 == '\0') goto LAB_0012ff54;
    }
    if (uVar9 == 0) {
      cVar6 = '\x01';
    }
    else {
      lVar11 = 0;
      do {
        _Var5._M_t.
        super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
        .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
             (this->attributes_decoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar11]._M_t.
             super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
             ._M_t;
        cVar6 = (**(code **)(*(long *)_Var5._M_t.
                                      super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                      .
                                      super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>
                                      ._M_head_impl + 0x18))
                          (_Var5._M_t.
                           super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                           .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                           _M_head_impl,this->buffer_);
        if (cVar6 == '\0') {
          return (bool)'\0';
        }
        bVar12 = (ulong)uVar9 - 1 != lVar11;
        lVar11 = lVar11 + 1;
      } while (bVar12);
    }
  }
  return (bool)cVar6;
}

Assistant:

bool PointCloudDecoder::DecodePointAttributesStep1() {

  uint8_t tmp_num_attributes_decoders;
  if (!buffer_->Decode(&tmp_num_attributes_decoders)) {
    return false;
  }
  // Create all attribute decoders. This is implementation specific and the
  // derived classes can use any data encoded in the
  // PointCloudEncoder::EncodeAttributesEncoderIdentifier() call.
  for (int i = 0; i < tmp_num_attributes_decoders; ++i) {
    if (!CreateAttributesDecoder(i)) {
      return false;
    }
  }

  // Initialize all attributes decoders. No data is decoded here.
  for (auto &att_dec : attributes_decoders_) {
    if (!att_dec->Init(this, point_cloud_)) {
      return false;
    }
  }

  // Decode any data needed by the attribute decoders.
  for (int i = 0; i < tmp_num_attributes_decoders; ++i) {
    if (!attributes_decoders_[i]->DecodeAttributesDecoderData(buffer_)) {
      return false;
    }
  }
  return true;
}